

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

Var Js::ScriptContext::DebugProfileProbeThunk(RecyclableObject *callable,CallInfo callInfo,...)

{
  undefined1 uVar1;
  ScriptContext *pSVar2;
  FunctionInfo *pFVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  int iVar8;
  undefined4 *puVar9;
  JavascriptFunction *this;
  code *pcVar10;
  FunctionProxy *pFVar11;
  FunctionBody *pFVar12;
  undefined4 extraout_var;
  DebugContext *pDVar13;
  DebuggingFlags *pDVar14;
  char16_t *pcVar15;
  int in_stack_00000010;
  undefined1 local_c0 [16];
  Var *local_b0;
  FunctionInfo **local_a8;
  DOMWrapperTracingDoneCallback local_a0;
  Arguments local_98;
  undefined1 local_88 [8];
  Arguments args;
  FunctionInfo *local_68;
  ThreadContext *threadContext;
  undefined1 local_58;
  undefined1 local_50 [8];
  Var aReturn;
  JavascriptFunction *function;
  ScriptContext *scriptContext;
  bool isOrigWrapperPresent;
  
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x11a0,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_006f1c81;
    *puVar9 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  local_88 = (undefined1  [8])callInfo;
  bVar5 = VarIsImpl<Js::WasmScriptFunction>(callable);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x11a2,"(!VarIs<WasmScriptFunction>(callable))",
                                "!VarIs<WasmScriptFunction>(callable)");
    if (!bVar5) goto LAB_006f1c81;
    *puVar9 = 0;
  }
  this = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(callable);
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  local_50 = (undefined1  [8])0x0;
  aReturn = this;
  function = (JavascriptFunction *)pSVar2;
  pcVar10 = FunctionInfo::GetOriginalEntryPoint((this->functionInfo).ptr);
  if (pSVar2->isEvalRestricted == true) {
    if (pcVar10 == GlobalObject::EntryEval) {
      pcVar10 = GlobalObject::EntryEvalRestrictedMode;
    }
    else if (pcVar10 == JavascriptFunction::NewInstance) {
      pcVar10 = JavascriptFunction::NewInstanceRestrictedMode;
    }
    else if (pcVar10 == JavascriptGeneratorFunction::NewInstance) {
      pcVar10 = JavascriptGeneratorFunction::NewInstanceRestrictedMode;
    }
    else if (pcVar10 == JavascriptFunction::NewAsyncFunctionInstance) {
      pcVar10 = JavascriptFunction::NewAsyncFunctionInstanceRestrictedMode;
    }
    else if (pcVar10 == JavascriptFunction::NewAsyncGeneratorFunctionInstance) {
      pcVar10 = JavascriptFunction::NewAsyncGeneratorFunctionInstanceRestrictedMode;
    }
  }
  local_c0._0_8_ = &function;
  threadContext = (ThreadContext *)local_c0;
  local_c0._8_8_ = local_50;
  local_b0 = &aReturn;
  local_58 = '\x01';
  BVar7 = JavascriptFunction::IsScriptFunction(this);
  if ((BVar7 != 0) &&
     (pFVar11 = JavascriptFunction::GetFunctionProxy((JavascriptFunction *)aReturn),
     pFVar11 == (FunctionProxy *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x121d,
                                "(!function->IsScriptFunction() || function->GetFunctionProxy())",
                                "!function->IsScriptFunction() || function->GetFunctionProxy()");
    if (!bVar5) {
LAB_006f1c81:
      pcVar10 = (code *)invalidInstructionException();
      (*pcVar10)();
    }
    *puVar9 = 0;
  }
  bVar5 = IsScriptContextInDebugMode((ScriptContext *)function);
  if ((bVar5) && (bVar5 = IsExceptionWrapperForBuiltInsEnabled((ScriptContext *)function), bVar5)) {
    bVar6 = JavascriptFunction::IsLibraryCode((JavascriptFunction *)aReturn);
    bVar4 = true;
    bVar5 = true;
    if (bVar6) {
      bVar5 = AutoRegisterIgnoreExceptionWrapper::IsRegistered
                        ((ThreadContext *)function[0x13].functionInfo.ptr);
      bVar5 = !bVar5;
      goto LAB_006f1ab0;
    }
  }
  else {
    bVar5 = false;
  }
  bVar4 = bVar5;
  bVar5 = false;
LAB_006f1ab0:
  if (DAT_0145948a == '\x01') {
    if (*(long *)(*(long *)((long)aReturn + 0x28) + 8) == 0) {
      pcVar15 = L"built-in/library";
    }
    else {
      pFVar12 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)aReturn);
      iVar8 = (*(pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar12);
      pcVar15 = (char16_t *)CONCAT44(extraout_var,iVar8);
    }
    bVar6 = AutoRegisterIgnoreExceptionWrapper::IsRegistered
                      ((ThreadContext *)function[0x13].functionInfo.ptr);
    Output::Trace(DebuggerPhase,
                  L"DebugProfileProbeThunk: calling function: %s isWrapperRegistered=%d useDebugWrapper=%d\n"
                  ,pcVar15,(ulong)bVar6,(ulong)bVar5);
  }
  bVar6 = IsDebuggerRecording((ScriptContext *)function);
  if (bVar6) {
    pDVar13 = GetDebugContext((ScriptContext *)function);
    ProbeContainer::StartRecordingCall(pDVar13->diagProbesContainer);
  }
  if (bVar5 == false) {
    local_98.Info = callInfo;
    if ((!bVar4) ||
       (bVar5 = JavascriptFunction::IsLibraryCode((JavascriptFunction *)aReturn), bVar5)) {
      pFVar3 = function[0x13].functionInfo.ptr;
      uVar1 = *(undefined1 *)((long)&pFVar3[8].functionBodyImpl.ptr + 1);
      *(undefined1 *)((long)&pFVar3[8].functionBodyImpl.ptr + 1) = 1;
      local_98.Values = (Type)&stack0x00000018;
      local_50 = (undefined1  [8])
                 JavascriptFunction::CallFunction<true>
                           ((RecyclableObject *)aReturn,pcVar10,&local_98,true);
      *(undefined1 *)((long)&pFVar3[8].functionBodyImpl.ptr + 1) = uVar1;
    }
    else {
      pFVar3 = function[0x13].functionInfo.ptr;
      local_68 = pFVar3;
      pDVar14 = DebugManager::GetDebuggingFlags((DebugManager *)pFVar3[5].originalEntryPoint);
      scriptContext._7_1_ = DebuggingFlags::IsBuiltInWrapperPresent(pDVar14);
      if ((bool)scriptContext._7_1_) {
        pDVar14 = DebugManager::GetDebuggingFlags((DebugManager *)pFVar3[5].originalEntryPoint);
        DebuggingFlags::SetIsBuiltInWrapperPresent(pDVar14,false);
      }
      local_a8 = &local_68;
      args.Values = &local_a8;
      local_a0 = (DOMWrapperTracingDoneCallback)((long)&scriptContext + 7);
      pFVar3 = function[0x13].functionInfo.ptr;
      uVar1 = *(undefined1 *)((long)&pFVar3[8].functionBodyImpl.ptr + 1);
      *(undefined1 *)((long)&pFVar3[8].functionBodyImpl.ptr + 1) = 1;
      local_98.Values = (Type)&stack0x00000018;
      local_50 = (undefined1  [8])
                 JavascriptFunction::CallFunction<true>
                           ((RecyclableObject *)aReturn,pcVar10,&local_98,true);
      *(undefined1 *)((long)&pFVar3[8].functionBodyImpl.ptr + 1) = uVar1;
      anon_func::FinallyObject::~FinallyObject((FinallyObject *)&args.Values);
    }
  }
  else {
    local_50 = (undefined1  [8])
               ProfileModeThunk_DebugModeWrapper
                         ((JavascriptFunction *)aReturn,(ScriptContext *)function,pcVar10,
                          (Arguments *)local_88);
  }
  local_58 = '\0';
  anon_func::FinallyObject::~FinallyObject((FinallyObject *)&threadContext);
  return (Var)local_50;
}

Assistant:

Var ScriptContext::DebugProfileProbeThunk(RecyclableObject* callable, CallInfo callInfo, ...)
    {
#if defined(ENABLE_SCRIPT_DEBUGGING) || defined(ENABLE_SCRIPT_PROFILING)
        RUNTIME_ARGUMENTS(args, callInfo);

        Assert(!VarIs<WasmScriptFunction>(callable));
        JavascriptFunction* function = VarTo<JavascriptFunction>(callable);
        ScriptContext* scriptContext = function->GetScriptContext();

        // We can come here when profiling is not on
        // e.g. User starts profiling, we update all thinks and then stop profiling - we don't update thunk
        // So we still get this call
#if defined(ENABLE_SCRIPT_PROFILING)
        bool functionEnterEventSent = false;
        char16 *pwszExtractedFunctionName = NULL;
        size_t functionNameLen = 0;
        const char16 *pwszFunctionName = NULL;
        HRESULT hrOfEnterEvent = S_OK;

        PROFILER_TOKEN scriptId = -1;
        PROFILER_TOKEN functionId = -1;
        const bool isProfilingUserCode = scriptContext->GetThreadContext()->IsProfilingUserCode();
        const bool isUserCode = !function->IsLibraryCode();

        const bool fProfile = (isUserCode || isProfilingUserCode) // Only report user code or entry library code
            && scriptContext->GetProfileInfo(function, scriptId, functionId);

        if (fProfile)
        {
            Js::FunctionBody *pBody = function->GetFunctionBody();
            if (pBody != nullptr && !pBody->HasFunctionCompiledSent())
            {
                pBody->RegisterFunction(false/*changeThunk*/);
            }

#if DEBUG
            { // scope

                Assert(scriptContext->IsProfiling());

                if (pBody && pBody->GetProfileSession() != pBody->GetScriptContext()->GetProfileSession())
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    OUTPUT_TRACE_DEBUGONLY(Js::ScriptProfilerPhase, _u("ScriptContext::ProfileProbeThunk, ProfileSession does not match (%d != %d), functionNumber : %s, functionName : %s\n"),
                        pBody->GetProfileSession(), pBody->GetScriptContext()->GetProfileSession(), pBody->GetDebugNumberSet(debugStringBuffer), pBody->GetDisplayName());
                }
                AssertMsg(pBody == NULL || pBody->GetProfileSession() == pBody->GetScriptContext()->GetProfileSession(), "Function info wasn't reported for this profile session");
            }
#endif // DEBUG

            if (functionId == -1)
            {
                Var sourceString = function->GetSourceString();

                // SourceString will be null for the Js::BoundFunction, don't throw Enter/Exit notification in that case.
                if (sourceString != NULL)
                {
                    if (TaggedInt::Is(sourceString))
                    {
                        PropertyId nameId = TaggedInt::ToInt32(sourceString);
                        pwszFunctionName = scriptContext->GetPropertyString(nameId)->GetSz();
                    }
                    else
                    {
                        // it is string because user had called in toString extract name from it
                        Assert(VarIs<JavascriptString>(sourceString));
                        const char16 *pwszToString = ((JavascriptString *)sourceString)->GetSz();
                        const char16 *pwszNameStart = wcsstr(pwszToString, _u(" "));
                        const char16 *pwszNameEnd = wcsstr(pwszToString, _u("("));
                        if (pwszNameStart == nullptr || pwszNameEnd == nullptr || ((int)(pwszNameEnd - pwszNameStart) <= 0))
                        {
                            functionNameLen = ((JavascriptString *)sourceString)->GetLength() + 1;
                            pwszExtractedFunctionName = HeapNewArray(char16, functionNameLen);
                            wcsncpy_s(pwszExtractedFunctionName, functionNameLen, pwszToString, _TRUNCATE);
                        }
                        else
                        {
                            functionNameLen = pwszNameEnd - pwszNameStart;
                            AssertMsg(functionNameLen < INT_MAX, "Allocating array with zero or negative length?");
                            pwszExtractedFunctionName = HeapNewArray(char16, functionNameLen);
                            wcsncpy_s(pwszExtractedFunctionName, functionNameLen, pwszNameStart + 1, _TRUNCATE);
                        }
                        pwszFunctionName = pwszExtractedFunctionName;
                    }

                    functionEnterEventSent = true;
                    Assert(pwszFunctionName != NULL);
                    hrOfEnterEvent = scriptContext->OnDispatchFunctionEnter(pwszFunctionName);
                }
            }
            else
            {
                hrOfEnterEvent = scriptContext->OnFunctionEnter(scriptId, functionId);
            }

            scriptContext->GetThreadContext()->SetIsProfilingUserCode(isUserCode); // Update IsProfilingUserCode state
        }
#endif // ENABLE_SCRIPT_PROFILING

        Var aReturn = NULL;
        JavascriptMethod origEntryPoint = function->GetFunctionInfo()->GetOriginalEntryPoint();

        if (scriptContext->IsEvalRestriction())
        {
            if (origEntryPoint == Js::GlobalObject::EntryEval)
            {
                origEntryPoint = Js::GlobalObject::EntryEvalRestrictedMode;
            }
            else if (origEntryPoint == Js::JavascriptFunction::NewInstance)
            {
                origEntryPoint = Js::JavascriptFunction::NewInstanceRestrictedMode;
            }
            else if (origEntryPoint == Js::JavascriptGeneratorFunction::NewInstance)
            {
                origEntryPoint = Js::JavascriptGeneratorFunction::NewInstanceRestrictedMode;
            }
            else if (origEntryPoint == Js::JavascriptFunction::NewAsyncFunctionInstance)
            {
                origEntryPoint = Js::JavascriptFunction::NewAsyncFunctionInstanceRestrictedMode;
            }
            else if (origEntryPoint == Js::JavascriptFunction::NewAsyncGeneratorFunctionInstance)
            {
                origEntryPoint = Js::JavascriptFunction::NewAsyncGeneratorFunctionInstanceRestrictedMode;
            }
        }

        __TRY_FINALLY_BEGIN // SEH is not guaranteed, see the implementation
        {
            Assert(!function->IsScriptFunction() || function->GetFunctionProxy());

            // No need to wrap script functions, also can't if the wrapper is already on the stack.
            // Treat "library code" script functions, such as Intl, as built-ins:
            // use the wrapper when calling them, and do not reset the wrapper when calling them.
            bool isDebugWrapperEnabled = scriptContext->IsScriptContextInDebugMode() && IsExceptionWrapperForBuiltInsEnabled(scriptContext);
            bool useDebugWrapper =
                isDebugWrapperEnabled &&
                function->IsLibraryCode() &&
                !AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->GetThreadContext());

            OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("DebugProfileProbeThunk: calling function: %s isWrapperRegistered=%d useDebugWrapper=%d\n"),
                function->GetFunctionInfo()->HasBody() ? function->GetFunctionBody()->GetDisplayName() : _u("built-in/library"), AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->GetThreadContext()), useDebugWrapper);

            if (scriptContext->IsDebuggerRecording())
            {
                scriptContext->GetDebugContext()->GetProbeContainer()->StartRecordingCall();
            }

            if (useDebugWrapper)
            {
                // For native use wrapper and bail out on to ignore exception.
                // Extract try-catch out of hot path in normal profile mode (presence of try-catch in a function is bad for perf).
                aReturn = ProfileModeThunk_DebugModeWrapper(function, scriptContext, origEntryPoint, args);
            }
            else
            {
                if (isDebugWrapperEnabled && !function->IsLibraryCode())
                {
                    // We want to ignore exception and continue into closest user/script function down on the stack.
                    // Thus, if needed, reset the wrapper for the time of this call,
                    // so that if there is library/helper call after script function, it will use try-catch.
                    // Can't use smart/destructor object here because of __try__finally.
                    ThreadContext* threadContext = scriptContext->GetThreadContext();
                    bool isOrigWrapperPresent = threadContext->GetDebugManager()->GetDebuggingFlags()->IsBuiltInWrapperPresent();
                    if (isOrigWrapperPresent)
                    {
                        threadContext->GetDebugManager()->GetDebuggingFlags()->SetIsBuiltInWrapperPresent(false);
                    }
                    __TRY_FINALLY_BEGIN // SEH is not guaranteed, see the implementation
                    {
                        aReturn = scriptContext->GetThreadContext()->SafeReentrantCall([=]()->Js::Var
                        {
                            // This can be an apply call or a spread so we have to use the large arg count
                            return JavascriptFunction::CallFunction<true>(function, origEntryPoint, args, /* useLargeArgCount */ true);
                        });
                    }
                    __FINALLY
                    {
                        threadContext->GetDebugManager()->GetDebuggingFlags()->SetIsBuiltInWrapperPresent(isOrigWrapperPresent);
                    }
                    __TRY_FINALLY_END
                }
                else
                {
                    // Can we update return address to a thunk that sends Exit event and then jmp to entry instead of Calling it.
                    // Saves stack space and it might be something we would be doing anyway for handling profile.Start/stop
                    // which can come anywhere on the stack.
                    aReturn = scriptContext->GetThreadContext()->SafeReentrantCall([=]()->Js::Var
                    {
                        // This can be an apply call or a spread so we have to use the large arg count
                        return JavascriptFunction::CallFunction<true>(function, origEntryPoint, args, /* useLargeArgCount */ true);
                    });
                }
            }
        }
        __FINALLY
        {
#if defined(ENABLE_SCRIPT_PROFILING)
            if (fProfile)
            {
                if (hrOfEnterEvent != ACTIVPROF_E_PROFILER_ABSENT)
                {
                    if (functionId == -1)
                    {
                        // Check whether we have sent the Enter event or not.
                        if (functionEnterEventSent)
                        {
                            scriptContext->OnDispatchFunctionExit(pwszFunctionName);
                            if (pwszExtractedFunctionName != NULL)
                            {
                                HeapDeleteArray(functionNameLen, pwszExtractedFunctionName);
                            }
                        }
                    }
                    else
                    {
                        scriptContext->OnFunctionExit(scriptId, functionId);
                    }
                }

                scriptContext->GetThreadContext()->SetIsProfilingUserCode(isProfilingUserCode); // Restore IsProfilingUserCode state
            }
#endif

            if (scriptContext->IsDebuggerRecording())
            {
                scriptContext->GetDebugContext()->GetProbeContainer()->EndRecordingCall(aReturn, function);
            }
        }